

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall enact::Parser::~Parser(Parser *this)

{
  Parser *this_local;
  
  Token::~Token(&this->m_current);
  Token::~Token(&this->m_previous);
  Lexer::~Lexer(&this->m_scanner);
  return;
}

Assistant:

~Parser() = default;